

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void wipeout_text(char *engr,int cnt,uint seed)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  uint local_34;
  uint local_30;
  int lth;
  int use_rubout;
  int nxt;
  int j;
  int i;
  char *s;
  uint seed_local;
  int cnt_local;
  char *engr_local;
  
  sVar1 = strlen(engr);
  local_34 = (uint)sVar1;
  if ((local_34 != 0) && (s._0_4_ = seed, s._4_4_ = cnt, 0 < cnt)) {
    while (iVar4 = s._4_4_ + -1, s._4_4_ != 0) {
      if ((uint)s == 0) {
        lth = rn2(local_34);
        local_30 = rn2(4);
      }
      else {
        lth = (uint)s % local_34;
        s._0_4_ = ((uint)s * 0x1f) % 0xff;
        local_30 = (uint)s & 3;
      }
      pcVar2 = engr + lth;
      s._4_4_ = iVar4;
      if (*pcVar2 != ' ') {
        pcVar3 = strchr("?.,\'`-|_",(int)*pcVar2);
        if (pcVar3 == (char *)0x0) {
          if (local_30 == 0) {
            nxt = 0x2b;
          }
          else {
            for (nxt = 0; nxt < 0x2b; nxt = nxt + 1) {
              if (*pcVar2 == rubouts[nxt].wipefrom) {
                if ((uint)s == 0) {
                  sVar1 = strlen(rubouts[nxt].wipeto);
                  use_rubout = rn2((int)sVar1);
                }
                else {
                  s._0_4_ = ((uint)s * 0x1f) % 0xff;
                  sVar1 = strlen(rubouts[nxt].wipeto);
                  use_rubout = (int)((ulong)(uint)s % sVar1);
                }
                *pcVar2 = rubouts[nxt].wipeto[use_rubout];
                break;
              }
            }
          }
          if (nxt == 0x2b) {
            *pcVar2 = '?';
          }
        }
        else {
          *pcVar2 = ' ';
        }
      }
    }
  }
  while( true ) {
    bVar5 = false;
    if (local_34 != 0) {
      bVar5 = engr[(int)(local_34 - 1)] == ' ';
    }
    if (!bVar5) break;
    local_34 = local_34 - 1;
    engr[(int)local_34] = '\0';
  }
  return;
}

Assistant:

void wipeout_text(char *engr,
		  int cnt,
		  unsigned seed) /* for semi-controlled randomization */
{
	char *s;
	int i, j, nxt, use_rubout, lth = (int)strlen(engr);

	if (lth && cnt > 0) {
	    while (cnt--) {
		/* pick next character */
		if (!seed) {
		    /* random */
		    nxt = rn2(lth);
		    use_rubout = rn2(4);
		} else {
		    /* predictable; caller can reproduce the same sequence by
		       supplying the same arguments later, or a pseudo-random
		       sequence by varying any of them */
		    nxt = seed % lth;
		    seed *= 31,  seed %= (BUFSZ-1);
		    use_rubout = seed & 3;
		}
		s = &engr[nxt];
		if (*s == ' ') continue;

		/* rub out unreadable & small punctuation marks */
		if (strchr("?.,'`-|_", *s)) {
		    *s = ' ';
		    continue;
		}

		if (!use_rubout)
		    i = SIZE(rubouts);
		else
		    for (i = 0; i < SIZE(rubouts); i++)
			if (*s == rubouts[i].wipefrom) {
			    /*
			     * Pick one of the substitutes at random.
			     */
			    if (!seed)
				j = rn2(strlen(rubouts[i].wipeto));
			    else {
				seed *= 31,  seed %= (BUFSZ-1);
				j = seed % (strlen(rubouts[i].wipeto));
			    }
			    *s = rubouts[i].wipeto[j];
			    break;
			}

		/* didn't pick rubout; use '?' for unreadable character */
		if (i == SIZE(rubouts)) *s = '?';
	    }
	}

	/* trim trailing spaces */
	while (lth && engr[lth-1] == ' ') engr[--lth] = 0;
}